

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrtran.c
# Opt level: O1

void png_set_background_fixed
               (png_structrp png_ptr,png_const_color_16p background_color,int background_gamma_code,
               int need_expand,png_fixed_point background_gamma)

{
  uint uVar1;
  byte *pbVar2;
  byte bVar3;
  undefined1 uVar4;
  png_uint_16 pVar5;
  png_uint_16 pVar6;
  png_uint_16 pVar7;
  uint uVar8;
  
  bVar3 = 1;
  if (png_ptr != (png_structrp)0x0) {
    if ((png_ptr->flags & 0x40) == 0) {
      png_ptr->flags = png_ptr->flags | 0x4000;
      bVar3 = 0;
    }
    else {
      png_app_error(png_ptr,"invalid after png_start_read_image or png_read_update_info");
    }
  }
  if (!(bool)(background_color == (png_const_color_16p)0x0 | bVar3)) {
    if (background_gamma_code == 0) {
      png_warning(png_ptr,"Application must supply a known background gamma");
      return;
    }
    uVar8 = png_ptr->transformations & 0xff7bff7f;
    uVar1 = uVar8 + 0x40080;
    png_ptr->transformations = uVar1;
    pbVar2 = (byte *)((long)&png_ptr->flags + 1);
    *pbVar2 = *pbVar2 & 0xdf;
    uVar4 = background_color->field_0x1;
    pVar5 = background_color->red;
    pVar6 = background_color->green;
    pVar7 = background_color->blue;
    (png_ptr->background).index = background_color->index;
    (png_ptr->background).field_0x1 = uVar4;
    (png_ptr->background).red = pVar5;
    (png_ptr->background).green = pVar6;
    (png_ptr->background).blue = pVar7;
    (png_ptr->background).gray = background_color->gray;
    png_ptr->background_gamma = background_gamma;
    png_ptr->background_gamma_type = (png_byte)background_gamma_code;
    if (need_expand == 0) {
      png_ptr->transformations = uVar1 & 0xff7ffeff;
    }
    else {
      png_ptr->transformations = uVar8 | 0x40180;
    }
  }
  return;
}

Assistant:

void PNGFAPI
png_set_background_fixed(png_structrp png_ptr,
    png_const_color_16p background_color, int background_gamma_code,
    int need_expand, png_fixed_point background_gamma)
{
   png_debug(1, "in png_set_background_fixed");

   if (png_rtran_ok(png_ptr, 0) == 0 || background_color == NULL)
      return;

   if (background_gamma_code == PNG_BACKGROUND_GAMMA_UNKNOWN)
   {
      png_warning(png_ptr, "Application must supply a known background gamma");
      return;
   }

   png_ptr->transformations |= PNG_COMPOSE | PNG_STRIP_ALPHA;
   png_ptr->transformations &= ~PNG_ENCODE_ALPHA;
   png_ptr->flags &= ~PNG_FLAG_OPTIMIZE_ALPHA;

   png_ptr->background = *background_color;
   png_ptr->background_gamma = background_gamma;
   png_ptr->background_gamma_type = (png_byte)(background_gamma_code);
   if (need_expand != 0)
      png_ptr->transformations |= PNG_BACKGROUND_EXPAND;
   else
      png_ptr->transformations &= ~PNG_BACKGROUND_EXPAND;
}